

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O0

void rep_match(lzma_lzma1_encoder *coder,uint32_t pos_state,uint32_t rep,uint32_t len)

{
  uint32_t uVar1;
  lzma_lzma_state lVar2;
  uint32_t distance;
  uint32_t len_local;
  uint32_t rep_local;
  uint32_t pos_state_local;
  lzma_lzma1_encoder *coder_local;
  
  if (rep == 0) {
    rc_bit(&coder->rc,coder->is_rep0 + coder->state,0);
    rc_bit(&coder->rc,coder->is_rep0_long[coder->state] + pos_state,(uint)(len != 1));
  }
  else {
    uVar1 = coder->reps[rep];
    rc_bit(&coder->rc,coder->is_rep0 + coder->state,1);
    if (rep == 1) {
      rc_bit(&coder->rc,coder->is_rep1 + coder->state,0);
    }
    else {
      rc_bit(&coder->rc,coder->is_rep1 + coder->state,1);
      rc_bit(&coder->rc,coder->is_rep2 + coder->state,rep - 2);
      if (rep == 3) {
        coder->reps[3] = coder->reps[2];
      }
      coder->reps[2] = coder->reps[1];
    }
    coder->reps[1] = coder->reps[0];
    coder->reps[0] = uVar1;
  }
  if (len == 1) {
    lVar2 = STATE_NONLIT_REP;
    if (coder->state < STATE_LIT_MATCH) {
      lVar2 = STATE_LIT_SHORTREP;
    }
    coder->state = lVar2;
  }
  else {
    length(&coder->rc,&coder->rep_len_encoder,pos_state,len,(_Bool)(coder->fast_mode & 1));
    lVar2 = STATE_NONLIT_REP;
    if (coder->state < STATE_LIT_MATCH) {
      lVar2 = STATE_LIT_LONGREP;
    }
    coder->state = lVar2;
  }
  return;
}

Assistant:

static inline void
rep_match(lzma_lzma1_encoder *coder, const uint32_t pos_state,
		const uint32_t rep, const uint32_t len)
{
	if (rep == 0) {
		rc_bit(&coder->rc, &coder->is_rep0[coder->state], 0);
		rc_bit(&coder->rc,
				&coder->is_rep0_long[coder->state][pos_state],
				len != 1);
	} else {
		const uint32_t distance = coder->reps[rep];
		rc_bit(&coder->rc, &coder->is_rep0[coder->state], 1);

		if (rep == 1) {
			rc_bit(&coder->rc, &coder->is_rep1[coder->state], 0);
		} else {
			rc_bit(&coder->rc, &coder->is_rep1[coder->state], 1);
			rc_bit(&coder->rc, &coder->is_rep2[coder->state],
					rep - 2);

			if (rep == 3)
				coder->reps[3] = coder->reps[2];

			coder->reps[2] = coder->reps[1];
		}

		coder->reps[1] = coder->reps[0];
		coder->reps[0] = distance;
	}

	if (len == 1) {
		update_short_rep(coder->state);
	} else {
		length(&coder->rc, &coder->rep_len_encoder, pos_state, len,
				coder->fast_mode);
		update_long_rep(coder->state);
	}
}